

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.cpp
# Opt level: O2

void __thiscall glslang::TInfoSinkBase::append(TInfoSinkBase *this,char *s)

{
  size_t growth;
  
  if ((this->outputStream & 4) != 0) {
    if (s != (char *)0x0) {
      growth = strlen(s);
      checkMem(this,growth);
    }
    std::__cxx11::string::append((char *)this);
  }
  if ((this->outputStream & 2) != 0) {
    fputs(s,_stdout);
    return;
  }
  return;
}

Assistant:

void TInfoSinkBase::append(const char* s)
{
    if (outputStream & EString) {
        if (s == nullptr)
            sink.append("(null)");
        else {
            checkMem(strlen(s));
            sink.append(s);
        }
    }

//#ifdef _WIN32
//    if (outputStream & EDebugger)
//        OutputDebugString(s);
//#endif

    if (outputStream & EStdOut)
        fprintf(stdout, "%s", s);
}